

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall cs::domain_manager::clear_domain(domain_manager *this)

{
  domain_type *in_RDI;
  stack_type<cs::domain_type,_std::allocator> *in_stack_00000030;
  
  if (*(long *)(in_RDI->m_reflect).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .ctrl_ == 0) {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_00000030);
    domain_type::clear(in_RDI);
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_00000030);
    domain_type::clear(in_RDI);
  }
  return;
}

Assistant:

void clear_domain()
		{
			if (fiber_stack != nullptr)
				fiber_stack->top().clear();
			else
				m_data.top().clear();
		}